

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcExtrudedAreaSolid::IfcExtrudedAreaSolid(IfcExtrudedAreaSolid *this)

{
  *(undefined ***)&this->field_0x70 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x78 = 0;
  *(char **)&this->field_0x80 = "IfcExtrudedAreaSolid";
  IfcSweptAreaSolid::IfcSweptAreaSolid
            (&this->super_IfcSweptAreaSolid,&PTR_construction_vtable_24__007d4bb8);
  *(undefined8 *)&(this->super_IfcSweptAreaSolid).field_0x58 = 0;
  *(undefined8 *)&(this->super_IfcSweptAreaSolid).field_0x60 = 0;
  (this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x7d4ad8;
  *(undefined8 *)&this->field_0x70 = 0x7d4ba0;
  *(undefined8 *)
   &(this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7d4b00;
  *(undefined8 *)
   &(this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x7d4b28;
  *(undefined8 *)
   &(this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    field_0x30 = 0x7d4b50;
  *(undefined8 *)&(this->super_IfcSweptAreaSolid).field_0x50 = 0x7d4b78;
  return;
}

Assistant:

IfcExtrudedAreaSolid() : Object("IfcExtrudedAreaSolid") {}